

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O1

void FAudioVoice_GetOutputFilterParameters
               (FAudioVoice *voice,FAudioVoice *pDestinationVoice,
               FAudioFilterParameters *pParameters)

{
  uint uVar1;
  FAudioSendDescriptor *pFVar2;
  FAudioVoice *pFVar3;
  long lVar4;
  FAudioVoice **ppFVar5;
  bool bVar6;
  
  if (voice->type == FAUDIO_VOICE_MASTER) {
    return;
  }
  FAudio_PlatformLockMutex(voice->sendLock);
  if (pDestinationVoice == (FAudioVoice *)0x0) {
    if ((voice->sends).SendCount == 1) {
      pDestinationVoice = ((voice->sends).pSends)->pOutputVoice;
    }
    else {
      pDestinationVoice = (FAudioVoice *)0x0;
    }
  }
  uVar1 = (voice->sends).SendCount;
  bVar6 = uVar1 != 0;
  if (bVar6) {
    pFVar2 = (voice->sends).pSends;
    if (pDestinationVoice == pFVar2->pOutputVoice) {
      lVar4 = 0;
    }
    else {
      lVar4 = 0;
      ppFVar5 = &pFVar2[1].pOutputVoice;
      do {
        if (uVar1 - 1 == (int)lVar4) goto LAB_00115ca7;
        lVar4 = lVar4 + 1;
        pFVar3 = *ppFVar5;
        ppFVar5 = (FAudioVoice **)((long)ppFVar5 + 0xc);
      } while (pDestinationVoice != pFVar3);
      bVar6 = (uint)lVar4 < uVar1;
    }
    if ((bVar6) && (((voice->sends).pSends[lVar4].Flags & 0x80) != 0)) {
      SDL_memcpy(pParameters,voice->sendFilter + lVar4,0xc);
    }
  }
LAB_00115ca7:
  FAudio_PlatformUnlockMutex(voice->sendLock);
  return;
}

Assistant:

void FAudioVoice_GetOutputFilterParameters(
	FAudioVoice *voice,
	FAudioVoice *pDestinationVoice,
	FAudioFilterParameters *pParameters
) {
	uint32_t i;

	LOG_API_ENTER(voice->audio)

	/* MSDN: "This method is usable only on source and submix voices and
	 * has no effect on mastering voices."
	 */
	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	/* Find the send index */
	if (pDestinationVoice == NULL && voice->sends.SendCount == 1)
	{
		pDestinationVoice = voice->sends.pSends[0].pOutputVoice;
	}
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		if (pDestinationVoice == voice->sends.pSends[i].pOutputVoice)
		{
			break;
		}
	}
	if (i >= voice->sends.SendCount)
	{
		LOG_ERROR(
			voice->audio,
			"Destination not attached to source: %p %p",
			(void*) voice,
			(void*) pDestinationVoice
		)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return;
	}

	if (!(voice->sends.pSends[i].Flags & FAUDIO_SEND_USEFILTER))
	{
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return;
	}

	/* Set the filter parameters, finally. */
	FAudio_memcpy(
		pParameters,
		&voice->sendFilter[i],
		sizeof(FAudioFilterParameters)
	);

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
}